

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_private.hh
# Opt level: O0

void __thiscall QPDF::Members::~Members(Members *this)

{
  Members *this_local;
  
  std::
  map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
  ::~map(&this->object_to_obj_users);
  std::
  map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  ::~map(&this->obj_user_to_objects);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&this->part9);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&this->part8);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&this->part7);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&this->part6);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&this->part4);
  CHSharedObject::~CHSharedObject(&this->c_shared_object_data);
  CHPageOffset::~CHPageOffset(&this->c_page_offset_data);
  HSharedObject::~HSharedObject(&this->shared_object_hints);
  HPageOffset::~HPageOffset(&this->page_offset_hints);
  QPDFObjectHandle::~QPDFObjectHandle(&this->lindict);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&this->resolved_object_streams);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(&this->copied_streams);
  std::
  map<unsigned_long_long,_QPDF::ObjCopier,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_QPDF::ObjCopier>_>_>
  ::~map(&this->object_copiers);
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::~vector(&this->warnings);
  std::
  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>::
  ~map(&this->pageobj_to_pages_pos);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&this->all_pages);
  QPDFObjectHandle::~QPDFObjectHandle(&this->trailer);
  std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::~set(&this->resolving);
  std::
  map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
  ::~map(&this->obj_cache);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&this->deleted_objects);
  std::
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  ::~map(&this->xref_table);
  std::__cxx11::string::~string((string *)&this->pdf_version);
  std::shared_ptr<QPDF::EncryptionParameters>::~shared_ptr(&this->encp);
  std::
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  ::~shared_ptr(&this->last_ostream_description);
  std::__cxx11::string::~string((string *)&this->last_object_description);
  std::shared_ptr<InputSource>::~shared_ptr(&this->file);
  ::qpdf::Tokenizer::~Tokenizer(&this->tokenizer);
  std::shared_ptr<QPDFLogger>::~shared_ptr(&this->log);
  return;
}

Assistant:

~Members() = default;